

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O3

int lnextkey(lua_State *L)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  table *tbl;
  lua_Integer lVar3;
  node *pnVar4;
  int in_ESI;
  uint key;
  uint keyhash;
  ulong uVar5;
  ulong uVar6;
  char *str;
  size_t sVar7;
  size_t sz_00;
  bool bVar8;
  size_t sz;
  size_t local_28;
  
  local_28 = in_RAX;
  tbl = get_table(L,in_ESI);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    if (0 < (long)tbl->sizearray) {
      uVar5 = 1;
      do {
        if (tbl->arraytype[uVar5 - 1] != '\0') goto LAB_00123347;
        bVar8 = uVar5 != (long)tbl->sizearray;
        uVar5 = uVar5 + 1;
      } while (bVar8);
    }
LAB_001232d5:
    if (tbl->sizehash == 0) {
      return 0;
    }
    pnVar4 = tbl->hash;
  }
  else {
    iVar2 = lua_type(L,2);
    local_28 = 0;
    if (iVar2 == 3) {
      uVar1 = tbl->sizearray;
      iVar2 = lua_isinteger(L,2);
      if (iVar2 == 0) {
        return 0;
      }
      lVar3 = lua_tointegerx(L,2,(int *)0x0);
      key = (uint)lVar3;
      iVar2 = 0;
      str = (char *)0x0;
      sz_00 = 0;
      keyhash = key;
      if ((int)key <= (int)uVar1 && 0 < (int)key) {
        if ((ulong)(key & 0x7fffffff) < (ulong)uVar1) {
          uVar6 = (ulong)(key & 0x7fffffff);
          do {
            uVar5 = uVar6 + 1;
            if (tbl->arraytype[uVar6] != '\0') {
LAB_00123347:
              lua_pushinteger(L,uVar5);
              return 1;
            }
            uVar6 = uVar5;
          } while (uVar5 != uVar1);
        }
        goto LAB_001232d5;
      }
    }
    else {
      str = luaL_checklstring(L,2,&local_28);
      iVar2 = 1;
      key = 0;
      if (local_28 == 0) {
        keyhash = 0;
        sz_00 = 0;
      }
      else {
        uVar5 = local_28 & 0xffffffff;
        sVar7 = local_28;
        do {
          keyhash = (uint)(byte)str[sVar7 - 1] + (int)(uVar5 >> 2) + (uint)uVar5 * 0x20 ^
                    (uint)uVar5;
          uVar5 = (ulong)keyhash;
          sVar7 = sVar7 + ~(local_28 >> 5);
          sz_00 = local_28;
        } while (local_28 >> 5 < sVar7);
      }
    }
    pnVar4 = lookup_key(tbl,keyhash,key,iVar2,str,sz_00);
    if (pnVar4 == (node *)0x0) {
      return 0;
    }
    pnVar4 = pnVar4 + 1;
    if (tbl->sizehash == (int)((ulong)((long)pnVar4 - (long)tbl->hash) >> 3) * -0x55555555) {
      return 0;
    }
  }
  pushkey(L,tbl->L,pnVar4);
  return 1;
}

Assistant:

static int
lnextkey(lua_State *L) {
	struct table *tbl = get_table(L,1);
	if (lua_isnoneornil(L,2)) {
		if (tbl->sizearray > 0) {
			int i;
			for (i=0;i<tbl->sizearray;i++) {
				if (tbl->arraytype[i] != VALUETYPE_NIL) {
					lua_pushinteger(L, i+1);
					return 1;
				}
			}
		}
		return pushfirsthash(L, tbl);
	}
	int kt = lua_type(L,2);
	uint32_t keyhash;
	int key = 0;
	int keytype;
	size_t sz=0;
	const char *str = NULL;
	int sizearray = tbl->sizearray;
	if (kt == LUA_TNUMBER) {
		if (!lua_isinteger(L, 2)) {
			return 0;
		}
		key = (int)lua_tointeger(L, 2);
		if (key > 0 && key <= sizearray) {
			lua_Integer i;
			for (i=key;i<sizearray;i++) {
				if (tbl->arraytype[i] != VALUETYPE_NIL) {
					lua_pushinteger(L, i+1);
					return 1;
				}
			}
			return pushfirsthash(L, tbl);
		}
		keyhash = (uint32_t)key;
		keytype = KEYTYPE_INTEGER;
	} else {
		str = luaL_checklstring(L, 2, &sz);
		keyhash = calchash(str, sz);
		keytype = KEYTYPE_STRING;
	}

	struct node *n = lookup_key(tbl, keyhash, key, keytype, str, sz);
	if (n) {
		++n;
		int index = n-tbl->hash;
		if (index == tbl->sizehash) {
			return 0;
		}
		pushkey(L, tbl->L, n);
		return 1;
	} else {
		return 0;
	}
}